

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

int aigerNumSize(uint x)

{
  int sz;
  int iVar1;
  
  iVar1 = 1;
  for (; 0x7f < x; x = x >> 7) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

static int aigerNumSize( unsigned x )
{
    int sz = 1;
    while (x & ~0x7f)
    {
        sz++;
        x >>= 7;
    }
    return sz;
}